

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

StuntDouble * __thiscall OpenMD::SelectionManager::beginUnselected(SelectionManager *this,int *i)

{
  OpenMDBitSet *this_00;
  int iVar1;
  
  this_00 = (this->ss_).bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((*(byte *)(this_00->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0) {
    *i = 0;
    iVar1 = 0;
  }
  else {
    iVar1 = OpenMDBitSet::nextOffBit(this_00,0);
    *i = iVar1;
    if (iVar1 == -1) {
      return (StuntDouble *)0x0;
    }
  }
  return (this->stuntdoubles_).
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_start[iVar1];
}

Assistant:

StuntDouble* SelectionManager::beginUnselected(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[STUNTDOUBLE].size())) {
      if (!ss_.bitsets_[STUNTDOUBLE][i]) {
        // check that this processor owns this stuntdouble
        if (stuntdoubles_[i] != NULL) return stuntdoubles_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[STUNTDOUBLE].firstOffBit();
    return i == -1 ? NULL : stuntdoubles_[i];
#endif
  }